

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<char_const*const>::operator==
          (ArrayPtr<char_const*const> *this,ArrayPtr<const_kj::StringPtr> *other)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  StringPtr *this_00;
  StringPtr local_38;
  ulong local_28;
  size_t i;
  ArrayPtr<const_kj::StringPtr> *other_local;
  ArrayPtr<const_char_*const> *this_local;
  
  sVar1 = *(size_t *)(this + 8);
  i = (size_t)other;
  other_local = (ArrayPtr<const_kj::StringPtr> *)this;
  sVar3 = ArrayPtr<const_kj::StringPtr>::size(other);
  if (sVar1 == sVar3) {
    for (local_28 = 0; local_28 < *(ulong *)(this + 8); local_28 = local_28 + 1) {
      this_00 = ArrayPtr<const_kj::StringPtr>::operator[]
                          ((ArrayPtr<const_kj::StringPtr> *)i,local_28);
      StringPtr::StringPtr(&local_38,*(char **)(*(long *)this + local_28 * 8));
      bVar2 = StringPtr::operator==(this_00,&local_38);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr<U>& other) const {
    if (size_ != other.size()) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }